

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::NBestSentencePieceText::NBestSentencePieceText
          (NBestSentencePieceText *this,NBestSentencePieceText *from)

{
  Rep *pRVar1;
  void *pvVar2;
  void *pvVar3;
  void **our_elems;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  InternalMetadata *this_00;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NBestSentencePieceText_0037d018;
  (this->nbests_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->nbests_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nbests_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nbests_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar4 = (from->nbests_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar1 = (from->nbests_).super_RepeatedPtrFieldBase.rep_;
    our_elems = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->nbests_).super_RepeatedPtrFieldBase,iVar4);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::TypeHandler>
              (&(this->nbests_).super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,iVar4,
               ((this->nbests_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->nbests_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->nbests_).super_RepeatedPtrFieldBase.current_size_;
    (this->nbests_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar1 = (this->nbests_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar4) {
      pRVar1->allocated_size = iVar4;
    }
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    pvVar3 = this_00->ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pbVar5 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar5,*(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

NBestSentencePieceText::NBestSentencePieceText(const NBestSentencePieceText& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      nbests_(from.nbests_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:sentencepiece.NBestSentencePieceText)
}